

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O0

void process_header(HttpRequest *req,HttpResponse *res)

{
  iterator iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer ppVar5;
  undefined1 *puVar6;
  _Rb_tree_color *p_Var7;
  reference pvVar8;
  size_t __val;
  string *header_value;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> tokens;
  undefined1 local_50 [8];
  string range;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  iterator iter;
  HttpResponse *res_local;
  HttpRequest *req_local;
  
  iter._M_node = (_Base_ptr)res;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_iterator(&local_20);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&req->_headers);
  while( true ) {
    range.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&req->_headers);
    bVar2 = std::operator!=(&local_20,(_Self *)((long)&range.field_2 + 8));
    if (!bVar2) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_20);
    iVar4 = std::__cxx11::string::compare((char *)ppVar5);
    if (iVar4 == 0) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_20);
      std::__cxx11::string::string((string *)local_50,(string *)&ppVar5->second);
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_50);
      *puVar6 = 0x20;
      std::__cxx11::string::append(local_50);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_78);
      getNumberByReg((string *)local_50,(vector<int,_std::allocator<int>_> *)local_78);
      HttpResponse::setStCode((HttpResponse *)iter._M_node,0xce);
      *(undefined1 *)((long)&iter._M_node[8]._M_left + 4) = 1;
      p_Var7 = (_Rb_tree_color *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_78,0);
      iter._M_node[8]._M_color = *p_Var7;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_78,1);
      iVar1 = iter;
      *(value_type *)&iter._M_node[8].field_0x4 = *pvVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_98,"Content-Length",&local_99);
      std::__cxx11::to_string
                (&local_c0,*(int *)&iter._M_node[8].field_0x4 - iter._M_node[8]._M_color);
      HttpResponse::addHeader((HttpResponse *)iVar1._M_node,&local_98,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_78);
      iVar1 = iter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"Accept-Ranges",&local_e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"bytes",&local_109);
      HttpResponse::addHeader((HttpResponse *)iVar1._M_node,&local_e0,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      iVar1 = iter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,"Content-Range",&local_131);
      __val = get_file_size((char *)iter._M_node[7]._M_right);
      std::__cxx11::to_string(&local_158,__val);
      header_value = (string *)std::__cxx11::string::append((string *)local_50);
      HttpResponse::addHeader((HttpResponse *)iVar1._M_node,&local_130,header_value);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78)
      ;
      std::__cxx11::string::~string((string *)local_50);
    }
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_20);
    iVar4 = std::__cxx11::string::compare((char *)ppVar5);
    if (iVar4 == 0) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_20);
      iVar4 = std::__cxx11::string::compare((char *)&ppVar5->second);
      iVar1 = iter;
      if (iVar4 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_178,"Connection",&local_179);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1a0,"Keep-Alive",&local_1a1);
        HttpResponse::addHeader((HttpResponse *)iVar1._M_node,&local_178,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        HttpRequest::setKeepAlive(req,true);
      }
    }
    bVar2 = HttpResponse::IsChunked((HttpResponse *)iter._M_node);
    iVar1 = iter;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,"Transfer-Encoding",&local_1c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f0,"chunked",&local_1f1);
      HttpResponse::addHeader((HttpResponse *)iVar1._M_node,&local_1c8,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_20);
  }
  uVar3 = accessable((char *)iter._M_node[7]._M_right);
  printf("access:%d",(ulong)uVar3);
  iVar4 = accessable((char *)iter._M_node[7]._M_right);
  if (iVar4 != 0) {
    HttpResponse::setStCode((HttpResponse *)iter._M_node,0x12e);
    iVar1 = iter;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"Location",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"/302.html",&local_241);
    HttpResponse::addHeader((HttpResponse *)iVar1._M_node,&local_218,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
  }
  return;
}

Assistant:

void process_header(HttpRequest &req, HttpResponse &res)
{
    map<string, string>::iterator iter;
    for (iter = req._headers.begin(); iter != req._headers.end(); ++iter) {
        if (iter->first.compare("Range") == 0) {
            // Range: bytes=0-1023
            string range = iter->second;
            range[5] = ' ';
            range.append("/");
            vector<int> tokens;
            getNumberByReg(range, tokens);
            res.setStCode(206);
            res.is_range = true;
            res.start_pos = tokens[0];
            res.end_pos = tokens[1];
            res.addHeader(CONTENT_LENGTH,
                          std::to_string(res.end_pos - res.start_pos));
            tokens.clear();
            res.addHeader("Accept-Ranges", "bytes");
            res.addHeader(
                CONTENT_RANGE,
                range.append(std::to_string(get_file_size(res.filename))));
        }
        if (iter->first.compare("Connection") == 0 &&
            iter->second.compare("Keep-Alive") == 0) {
            res.addHeader("Connection", "Keep-Alive");
            req.setKeepAlive(true);
        }
        if (res.IsChunked()) {
            res.addHeader("Transfer-Encoding", "chunked");
        }
    }
    printf("access:%d", accessable(res.filename));
    if (accessable(res.filename) != 0) {
        res.setStCode(302);
        res.addHeader("Location", "/302.html");
    }
}